

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid
          (Scanner<UTF8EncodingPolicyBase<false>_> *this)

{
  anon_class_16_2_778bcaeb local_40;
  anon_class_16_2_5bfe327a local_30;
  tokens local_20;
  byte local_19;
  tokens result;
  BYTE deferredParseFlagsSave;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  _result = this;
  if ((byte)this->field_0x508 >> 6 == 0) {
    this_local._4_4_ = Scan(this);
  }
  else {
    local_19 = (byte)this->field_0x508 >> 6;
    this->field_0x508 = this->field_0x508 & 0x3f;
    local_20 = tkEOF;
    local_30.result = &local_20;
    local_40.deferredParseFlagsSave = &local_19;
    local_40.this = this;
    local_30.this = this;
    TryFinally<Scanner<UTF8EncodingPolicyBase<false>>::ScanForcingPid()::_lambda()_1_,Scanner<UTF8EncodingPolicyBase<false>>::ScanForcingPid()::_lambda(bool)_1_>
              (&local_30,&local_40);
    this_local._4_4_ = local_20;
  }
  return this_local._4_4_;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanForcingPid()
{
    if (m_DeferredParseFlags != ScanFlagNone)
    {
        BYTE deferredParseFlagsSave = m_DeferredParseFlags;
        m_DeferredParseFlags = ScanFlagNone;
        tokens result = tkEOF;
        TryFinally(
            [&]() /* try block */
            {
                result = this->Scan();
            },
            [&](bool) /* finally block */
            {
                this->m_DeferredParseFlags = deferredParseFlagsSave;
            });

        return result;
    }
    return Scan();
}